

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O3

HitList<DNA> * __thiscall
Search<DNA>::Query(HitList<DNA> *__return_storage_ptr__,Search<DNA> *this,Sequence<DNA> *query)

{
  Strand SVar1;
  Sequence<DNA> local_108;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  HitList<DNA> *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>)._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::_M_initialize_map
            (&__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>,0);
  SVar1 = this->mParams->strand;
  if ((SVar1 & ~Both) == Plus) {
    local_a8._8_8_ = 0;
    local_98._8_8_ =
         std::
         _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:87:14)>
         ::_M_invoke;
    local_98._0_8_ =
         std::
         _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:87:14)>
         ::_M_manager;
    local_a8._0_8_ = __return_storage_ptr__;
    (**this->_vptr_Search)(this,query);
    if ((code *)local_98._0_8_ != (code *)0x0) {
      (*(code *)local_98._0_8_)(local_a8,local_a8,3);
    }
  }
  if (SVar1 - Minus < 2) {
    Sequence<DNA>::Reverse(&local_108,query);
    Sequence<DNA>::Complement((Sequence<DNA> *)local_a8,&local_108);
    local_40 = 0;
    local_30 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:95:7)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:95:7)>
               ::_M_manager;
    local_48 = __return_storage_ptr__;
    (**this->_vptr_Search)(this,local_a8);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    if (local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
    if ((HitList<DNA> *)local_a8._0_8_ != (HitList<DNA> *)local_98) {
      operator_delete((void *)local_a8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.sequence._M_dataplus._M_p != &local_108.sequence.field_2) {
      operator_delete(local_108.sequence._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.quality._M_dataplus._M_p != &local_108.quality.field_2) {
      operator_delete(local_108.quality._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.identifier._M_dataplus._M_p != &local_108.identifier.field_2) {
      operator_delete(local_108.identifier._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline HitList< DNA > Search< DNA >::Query( const Sequence< DNA >& query ) {
  HitList< DNA > hits;

  auto strand = mParams.strand;

  if( strand == DNA::Strand::Plus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query, [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Plus } );
      } );
  }

  if( strand == DNA::Strand::Minus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query.Reverse().Complement(),
      [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Minus } );
      } );
  }

  return hits;
}